

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 float32_to_floatx80_mipsel(float32 a,float_status *status)

{
  commonNaNT a_00;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  floatx80 fVar7;
  floatx80 fVar8;
  commonNaNT z;
  undefined7 uStack_17;
  
  if ((status->flush_inputs_to_zero == '\0') || ((a & 0x7fffff) == 0 || (a & 0x7f800000) != 0)) {
    uVar3 = (ulong)a;
  }
  else {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    uVar3 = (ulong)(a & 0x80000000);
  }
  uVar2 = (uint)uVar3;
  uVar1 = uVar2 & 0x7fffff;
  iVar4 = (int)(uVar3 >> 0x1f);
  if ((char)(uVar3 >> 0x17) == '\0') {
    if ((uVar3 & 0x7fffff) == 0) {
      return (floatx80)(ZEXT416((uint)(iVar4 << 0xf)) << 0x40);
    }
    uVar2 = 0x1f;
    if ((uVar3 & 0x7fffff) != 0) {
      for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar1 = uVar1 << ((char)(uVar2 ^ 0x1f) - 8U & 0x1f);
    uVar5 = 9 - (uVar2 ^ 0x1f);
  }
  else {
    uVar5 = (uint)(uVar3 >> 0x17) & 0xff;
    if (uVar5 == 0xff) {
      if ((uVar3 & 0x7fffff) == 0) {
        fVar8._8_4_ = iVar4 << 0xf | 0x7fff;
        fVar8.low = 0x8000000000000000;
        fVar8._12_4_ = 0;
        return fVar8;
      }
      if (status->snan_bit_is_one == '\0') {
        bVar6 = (uVar3 & 0x3fffff) != 0 && (uVar2 & 0x7fc00000) == 0x7f800000;
      }
      else {
        bVar6 = 0xff7fffff < uVar2 * 2;
      }
      if (bVar6) {
        status->float_exception_flags = status->float_exception_flags | 1;
      }
      a_00._1_7_ = uStack_17;
      a_00.sign = (char)(uVar3 >> 0x1f);
      a_00.high = uVar3 << 0x29;
      a_00.low = 0;
      fVar8 = commonNaNToFloatx80(a_00,status);
      return fVar8;
    }
  }
  fVar7.low = (ulong)(uVar1 | 0x800000) << 0x28;
  fVar7._8_4_ = iVar4 * 0x8000 + uVar5 + 0x3f80;
  fVar7._12_4_ = 0;
  return fVar7;
}

Assistant:

float32 float32_squash_input_denormal(float32 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float32_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float32_set_sign(float32_zero, p.sign);
        }
    }
    return a;
}